

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O1

_Bool player_has_temporary_slay(player *p,wchar_t idx)

{
  _Bool _Var1;
  int *piVar2;
  ulong uVar3;
  
  piVar2 = &timed_effects[0].temp_slay;
  _Var1 = true;
  uVar3 = 0;
  while ((*piVar2 != idx || (p->timed[uVar3] == 0))) {
    _Var1 = uVar3 < 0x34;
    uVar3 = uVar3 + 1;
    piVar2 = piVar2 + 0x1e;
    if (uVar3 == 0x35) {
      return _Var1;
    }
  }
  return _Var1;
}

Assistant:

bool player_has_temporary_slay(const struct player *p, int idx)
{
	int i = 0;

	while (i < TMD_MAX) {
		if (timed_effects[i].temp_slay == idx && p->timed[i]) {
			return true;
		}
		++i;
	}
	return false;
}